

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool valid_repe(cs_struct *h,uint opcode)

{
  unsigned_short uVar1;
  uint uVar2;
  int in_ESI;
  int i;
  uint id;
  unsigned_short **in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = insn_find((insn_map *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
                    ,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (uVar1 == 0) {
    return false;
  }
  uVar2 = (uint)insns[(int)(uint)uVar1].mapid;
  if ((2 < uVar2 - 0x60) && (uVar2 != 0x26e)) {
    if (uVar2 == 0x26f) {
      if (in_ESI == 0xa31) {
        return true;
      }
      return false;
    }
    if (1 < uVar2 - 0x270) {
      if (uVar2 != 0x53b) {
        return false;
      }
      if (in_ESI == 0x23d) {
        return true;
      }
      return false;
    }
  }
  return true;
}

Assistant:

static bool valid_repe(cs_struct *h, unsigned int opcode)
{
	unsigned int id;
	int i = insn_find(insns, ARR_SIZE(insns), opcode, &h->insn_cache);
	if (i != 0) {
		id = insns[i].mapid;
		switch(id) {
			default:
				return false;

			case X86_INS_CMPSB:
			case X86_INS_CMPSW:
			case X86_INS_CMPSQ:

			case X86_INS_SCASB:
			case X86_INS_SCASW:
			case X86_INS_SCASQ:
				return true;

			// following are some confused instructions, which have the same
			// mnemonics in 128bit media instructions. Intel is horribly crazy!
			case X86_INS_CMPSD:
				if (opcode == X86_CMPSL) // REP CMPSD
					return true;
				return false;

			case X86_INS_SCASD:
				if (opcode == X86_SCASL) // REP SCASD
					return true;
				return false;
		}
	}

	// not found
	return false;
}